

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong *puVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  uint __val;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar10;
  typed_value<float,_char> *ptVar11;
  const_iterator cVar12;
  long *plVar13;
  any *paVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  float *pfVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long *plVar20;
  int *piVar21;
  uint __len;
  Mat inputImage;
  string inputPath;
  Rect cropRectangle;
  string __str;
  string outputPath;
  string modelPath;
  CascadeClassifier cascade;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> detectedFaces;
  FileStorage fs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argList;
  options_description desc;
  variables_map vm;
  uint local_3cc;
  undefined1 local_3c8 [64];
  int *local_388;
  ulong *local_368;
  undefined8 local_360;
  ulong local_358;
  undefined8 uStack_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  string local_328;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int *local_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0 [2];
  float local_2cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  CascadeClassifier local_268 [16];
  void *local_258;
  undefined8 uStack_250;
  long local_248;
  int *local_238;
  int *piStack_230;
  long local_228;
  path local_218 [2];
  _InputArray local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  undefined8 local_188;
  int local_180;
  int local_17c;
  long *local_178 [2];
  long local_168 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  long local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a0,argv,
             argv + argc,(allocator_type *)local_d0);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  pcVar2 = local_3c8 + 0x10;
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Options for helium","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)local_3c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_288._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_288,"help");
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar10->m_required = true;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"input",(char *)ptVar10);
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar10->m_required = true;
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"out","");
  ptVar10 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3c8);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"output",(char *)ptVar10);
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar3 = &local_218[0]._M_pathname.field_2;
  local_218[0]._M_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"internal","");
  ptVar10 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar10,&local_218[0]._M_pathname);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"model",(char *)ptVar10);
  ptVar11 = boost::program_options::value<float>((float *)0x0);
  local_2c8._M_dataplus._M_p._0_4_ = 0x40000000;
  ptVar11 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar11,(float *)&local_2c8);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"zoom",(char *)ptVar11);
  ptVar11 = boost::program_options::value<float>((float *)0x0);
  local_348 = (long *)CONCAT44(local_348._4_4_,0x3d4ccccd);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"0.05","");
  ptVar11 = boost::program_options::typed_value<float,_char>::default_value
                      (ptVar11,(float *)&local_348,&local_328);
  boost::program_options::options_description_easy_init::operator()
            (pcVar9,(value_semantic *)"min-size",(char *)ptVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_218[0]._M_pathname._M_dataplus._M_p,
                    local_218[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_f8.super_function_base.vtable = (vtable_base *)0x0;
  local_f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_f8.super_function_base.functor._8_8_ = 0;
  local_f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_3c8,argc,argv,(options_description *)local_178,0,
             &local_f8);
  boost::program_options::store((basic_parsed_options *)local_3c8,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_3c8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_f8);
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"help","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_c0,(key_type *)local_3c8);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  if (argc == 1 || cVar12._M_node != &local_b8) {
    plVar13 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_178);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    iVar7 = 1;
    std::ostream::flush();
    goto LAB_0010877f;
  }
  boost::program_options::notify((variables_map *)local_d0);
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"input","");
  paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar15 = boost::any_cast<std::__cxx11::string_const&>(paVar14);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  pcVar4 = (pbVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,pcVar4,pcVar4 + pbVar15->_M_string_length);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"model","");
  paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar15 = boost::any_cast<std::__cxx11::string_const&>(paVar14);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  pcVar4 = (pbVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar4,pcVar4 + pbVar15->_M_string_length);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"output","");
  paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar15 = boost::any_cast<std::__cxx11::string_const&>(paVar14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar4 = (pbVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar4,pcVar4 + pbVar15->_M_string_length);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"zoom","");
  paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pfVar16 = boost::any_cast<float_const&>(paVar14);
  local_2cc = *pfVar16;
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  local_3c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"min-size","");
  paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pfVar16 = boost::any_cast<float_const&>(paVar14);
  local_2f8 = (int *)CONCAT44(local_2f8._4_4_,*pfVar16);
  if ((pointer)local_3c8._0_8_ != pcVar2) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_3c8,&local_328,auto_format);
  cVar6 = std::filesystem::status((path *)local_3c8);
  std::filesystem::__cxx11::path::~path((path *)local_3c8);
  if (cVar6 == '\x01') {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_3c8,&local_2c8,auto_format);
    cVar6 = std::filesystem::status((path *)local_3c8);
    std::filesystem::__cxx11::path::~path((path *)local_3c8);
    if (cVar6 != '\x02') {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_3c8,&local_2c8,auto_format);
      cVar6 = std::filesystem::create_directory((path *)local_3c8);
      std::filesystem::__cxx11::path::~path((path *)local_3c8);
      if (cVar6 == '\0') {
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_2c8._M_dataplus._M_p,
                             local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17," is not a directory and could not be created.",0x2d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        goto LAB_00107ef2;
      }
    }
    cv::imread((string *)local_3c8,(int)&local_328);
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      cv::CascadeClassifier::CascadeClassifier(local_268);
      iVar7 = std::__cxx11::string::compare((char *)&local_288);
      if (iVar7 == 0) {
        cv::FileStorage::FileStorage((FileStorage *)local_218);
        local_348 = &local_338;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_348,
                   "<?xml version=\"1.0\"?>\n<!--\n    Tree-based 20x20 gentle adaboost frontal face detector.\n    Created by Rainer Lienhart.\n\n////////////////////////////////////////////////////////////////////////////////////////\n\n  IMPORTANT: READ BEFORE DOWNLOADING, COPYING, INSTALLING OR USING.\n\n  By downloading, copying, installing or using the software you agree to this license.\n  If you do not agree to this license, do not download, install,\n  copy or use the software.\n\n\n                        Intel License Agreement\n                For Open Source Computer Vision Library\n\n Copyright (C) 2000, Intel Corporation, all rights reserved.\n Third party copyrights are property of their respective owners.\n\n Redistribution and use in source and binary forms, with or without modification,\n are permitted provided that the following conditions are met:\n\n   * Redistribution\'s of source code must retain the above copyright notice,\n     this list of conditions and the following disclaimer.\n\n   * Redistribution\'s in binary form must reproduce the above copyright notice,\n     this list of conditions and the following disclaimer in the documentation\n     and/or other materials provided with the distribution.\n\n   * The name of Intel Corporation may not be used to endorse or promote products\n     derived from this software without specific prior written permission.\n\n This software is provided by the copyright holders and contributors \"as is\" and\n any express or implied warranties, including, but not limited to, the implied\n warranties of merchantability and fitness for a particular purpose are disclaimed.\n In no event shall the Intel Corporation or contributors be liable for any direct,\n indirect, incidental, special, exemplary, or consequential damages\n (including, but not limited to, procurement of substitute goods or services;\n loss of use, data, or profits; or business interruption) however caused\n and on any theory of liability, whether in contract, strict liability,\n or tort (including negligence or otherwise) arising in any way out of\n the ..." /* TRUNCATED STRING LITERAL */
                   ,"");
        local_360 = 0;
        local_358 = local_358 & 0xffffffffffffff00;
        local_368 = &local_358;
        cv::FileStorage::open((string *)local_218,(int)&local_348,(string *)0x4);
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        cv::FileStorage::getFirstTopLevelNode();
        cv::CascadeClassifier::read((FileNode *)local_268);
        cv::FileStorage::~FileStorage((FileStorage *)local_218);
LAB_001080b8:
        iVar7 = local_388[1];
        if (local_388[1] < *local_388) {
          iVar7 = *local_388;
        }
        local_180 = (int)(local_2f8._0_4_ * (float)iVar7);
        local_228 = 0;
        local_238 = (int *)0x0;
        piStack_230 = (int *)0x0;
        local_218[0]._M_pathname.field_2._M_allocated_capacity = 0;
        local_218[0]._M_pathname._M_dataplus._M_p._0_4_ = 0x1010000;
        local_188 = 0;
        local_218[0]._M_pathname._M_string_length = (size_type)local_3c8;
        local_17c = local_180;
        cv::CascadeClassifier::detectMultiScale
                  (0x9999999a,local_268,local_218,&local_238,3,0,&local_180,&local_188);
        local_2f8 = piStack_230;
        if (local_238 != piStack_230) {
          local_3cc = 1;
          piVar21 = local_238;
          do {
            local_300 = (int)((float)piVar21[2] * local_2cc);
            local_2fc = (int)((float)piVar21[3] * local_2cc);
            iVar7 = (piVar21[2] - local_300) / 2;
            local_308 = iVar7 + *piVar21;
            local_304 = (piVar21[3] - local_2fc) / 2 + piVar21[1];
            iVar7 = iVar7 + *piVar21;
            if ((((iVar7 < 0) || (local_304 < 0)) || (local_388[1] < iVar7 + local_300)) ||
               (*local_388 < local_304 + local_2fc)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Face ",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
              poVar17 = (ostream *)std::ostream::operator<<(&std::cerr,piVar21[2]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," x ",3);
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,piVar21[3]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," from (",7);
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,*piVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,piVar21[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,")]",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17," could not be saved (zoom too large)",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
              std::ostream::put((char)poVar17);
              std::ostream::flush();
            }
            else {
              local_2a8 = local_298;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a8,local_2c8._M_dataplus._M_p,
                         local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
              std::__cxx11::string::append((char *)&local_2a8);
              __val = -local_3cc;
              if (0 < (int)local_3cc) {
                __val = local_3cc;
              }
              __len = 1;
              if (9 < __val) {
                uVar19 = (ulong)__val;
                uVar5 = 4;
                do {
                  __len = uVar5;
                  uVar8 = (uint)uVar19;
                  if (uVar8 < 100) {
                    __len = __len - 2;
                    goto LAB_001083d4;
                  }
                  if (uVar8 < 1000) {
                    __len = __len - 1;
                    goto LAB_001083d4;
                  }
                  if (uVar8 < 10000) goto LAB_001083d4;
                  uVar19 = uVar19 / 10000;
                  uVar5 = __len + 4;
                } while (99999 < uVar8);
                __len = __len + 1;
              }
LAB_001083d4:
              local_2f0 = local_2e0;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2f0,(char)__len - (char)((int)local_3cc >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(local_3cc >> 0x1f) + (long)local_2f0),__len,__val);
              uVar19 = 0xf;
              if (local_2a8 != local_298) {
                uVar19 = local_298[0];
              }
              if (uVar19 < (ulong)(local_2e8 + local_2a0)) {
                uVar19 = 0xf;
                if (local_2f0 != local_2e0) {
                  uVar19 = local_2e0[0];
                }
                if (uVar19 < (ulong)(local_2e8 + local_2a0)) goto LAB_0010847c;
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_2a8);
              }
              else {
LAB_0010847c:
                puVar18 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_2f0);
              }
              local_368 = &local_358;
              puVar1 = puVar18 + 2;
              if ((ulong *)*puVar18 == puVar1) {
                local_358 = *puVar1;
                uStack_350 = puVar18[3];
              }
              else {
                local_358 = *puVar1;
                local_368 = (ulong *)*puVar18;
              }
              local_360 = puVar18[1];
              *puVar18 = puVar1;
              puVar18[1] = 0;
              *(undefined1 *)puVar1 = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_368);
              local_348 = &local_338;
              plVar20 = plVar13 + 2;
              if ((long *)*plVar13 == plVar20) {
                local_338 = *plVar20;
                lStack_330 = plVar13[3];
              }
              else {
                local_338 = *plVar20;
                local_348 = (long *)*plVar13;
              }
              local_340 = plVar13[1];
              *plVar13 = (long)plVar20;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              cv::Mat::Mat((Mat *)local_218,(Mat *)local_3c8,(Rect_ *)&local_308);
              local_1b8.sz.width = 0;
              local_1b8.sz.height = 0;
              local_1b8.flags = 0x1010000;
              local_248 = 0;
              local_258 = (void *)0x0;
              uStack_250 = 0;
              local_1b8.obj = local_218;
              cv::imwrite((string *)&local_348,&local_1b8,(vector *)&local_258);
              if (local_258 != (void *)0x0) {
                operator_delete(local_258,local_248 - (long)local_258);
              }
              cv::Mat::~Mat((Mat *)local_218);
              if (local_348 != &local_338) {
                operator_delete(local_348,local_338 + 1);
              }
              if (local_368 != &local_358) {
                operator_delete(local_368,local_358 + 1);
              }
              if (local_2f0 != local_2e0) {
                operator_delete(local_2f0,local_2e0[0] + 1);
              }
              if (local_2a8 != local_298) {
                operator_delete(local_2a8,local_298[0] + 1);
              }
              local_3cc = local_3cc + 1;
            }
            piVar21 = piVar21 + 4;
          } while (piVar21 != local_2f8);
        }
        if (local_238 != (int *)0x0) {
          operator_delete(local_238,local_228 - (long)local_238);
        }
        iVar7 = 0;
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (local_218,&local_288,auto_format);
        cVar6 = std::filesystem::status(local_218);
        std::filesystem::__cxx11::path::~path(local_218);
        if (cVar6 == '\x01') {
          cv::CascadeClassifier::load((string *)local_268);
          goto LAB_001080b8;
        }
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_288._M_dataplus._M_p,
                             local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," does not exist.",0x10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        iVar7 = -1;
        std::ostream::flush();
      }
      cv::CascadeClassifier::~CascadeClassifier(local_268);
    }
    else {
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_328._M_dataplus._M_p,
                           local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," couldn\'t be read",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      iVar7 = -1;
      std::ostream::flush();
    }
    cv::Mat::~Mat((Mat *)local_3c8);
  }
  else {
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_328._M_dataplus._M_p,local_328._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," is not a file.",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
LAB_00107ef2:
    std::ostream::put((char)poVar17);
    iVar7 = -1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
LAB_0010877f:
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_110);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_118 - (long)local_138);
    local_138 = (void *)0x0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    local_118 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_150);
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  local_d0[0] = std::streambuf::sync;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
  return iVar7;
}

Assistant:

int main(int argc, char **argv) {
  std::vector<std::string> argList(argv, argv + argc);
  po::variables_map vm;

  // Get options
  po::options_description desc("Options for helium");
  desc.add_options()("help", "produce help message")(
      "input", po::value<std::string>()->required(), "input file")(
      "output", po::value<std::string>()->required()->default_value("out"),
      "output folder")(
      "model", po::value<std::string>()->default_value("internal"),
      "model file ('internal' to use haarcascade_frontalface_alt2)")(
      "zoom", po::value<float>()->default_value(2),
      "zoom factor (0.5 = half size, 2 = double size)")(
      "min-size", po::value<float>()->default_value(0.05, "0.05"),
      "minimum face size (0.05 = 5% of image size, 0.5 = 50% of image "
      "size)");
  po::store(po::parse_command_line(argc, argv, desc), vm);

  // Return help message
  if (vm.count("help") || argc == 1) {
    std::cout << desc << std::endl;
    return 1;
  }

  // Raise errors about incorrect options
  po::notify(vm);

  // Cast variables from  variable map
  const std::string inputPath = vm["input"].as<std::string>();
  const std::string modelPath = vm["model"].as<std::string>();
  const std::string outputPath = vm["output"].as<std::string>();
  const float zoomLevel = vm["zoom"].as<float>();
  const float minimumSize = vm["min-size"].as<float>();

  // Error if input path is not a file
  if (!fs::is_regular_file(inputPath)) {
    std::cerr << inputPath << " is not a file." << std::endl;
    return -1;
  }

  // Ensure the output path exists or can be created
  if (!fs::is_directory(outputPath)) {
    if (!fs::create_directory(outputPath)) {
      std::cerr << outputPath << " is not a directory and could not be created."
                << std::endl;
      return -1;
    }
  }

  // Load the input image
  cv::Mat inputImage = cv::imread(inputPath);

  // Error if image is empty
  if (inputImage.empty()) {
    std::cerr << inputPath << " couldn't be read" << std::endl;
    return -1;
  }

  // Initialize cascade classifier
  CascadeClassifier cascade;

  if (modelPath == "internal") {
    // Open in-memory model
    cv::FileStorage fs;
    fs.open(std::string(cascade_model),
            FileStorage::READ | FileStorage::MEMORY);

    // Load model into cascade classifier
    cascade.read(fs.getFirstTopLevelNode());
  } else {
    // Error if model path is not a file
    if (!fs::is_regular_file(modelPath)) {
      std::cerr << modelPath << " does not exist." << std::endl;
      return -1;
    }

    // Load model into cascade classifier
    cascade.load(modelPath);
  }

  // The minimum size for detected faces is based on the larger of the
  // image's sides multiplied by a ratio
  const int greatestImageSideLength =
      max(inputImage.size().height, inputImage.size().width);
  const int minimumFaceLength = (greatestImageSideLength * minimumSize);
  cv::Size minimumFaceSize = cv::Size(minimumFaceLength, minimumFaceLength);

  // Use the cascade model to detect faces as Rects in detectedFaces
  std::vector<Rect> detectedFaces;
  cascade.detectMultiScale(inputImage, detectedFaces, 1.1, 3, 0,
                           minimumFaceSize);

  // Loop over every detected face
  int imageId = 1;
  for (const Rect &faceArea : detectedFaces) {
    // Set the crop rectangle to the detected face before performing zoom
    // transformation
    Rect cropRectangle = faceArea;

    // Apply the zoom level
    cropRectangle.width = faceArea.width * zoomLevel;
    cropRectangle.height = faceArea.height * zoomLevel;

    cropRectangle.x += ((faceArea.width - cropRectangle.width) / 2);
    cropRectangle.y += ((faceArea.height - cropRectangle.height) / 2);

    // If the new crop rectangle would try to read nonexistent pixels, skip
    if ((cropRectangle.x < 0) || (cropRectangle.y < 0) ||
        ((cropRectangle.x + cropRectangle.width) > inputImage.size().width) ||
        ((cropRectangle.y + cropRectangle.height) > inputImage.size().height)) {
      std::cerr << "Face " << faceArea << " could not be saved (zoom too large)"
                << std::endl;
      continue;
    }

    // Write a cropped version of the image
    cv::imwrite((outputPath + "/" + std::to_string(imageId) + ".jpg"),
                inputImage(cropRectangle));

    imageId++;
  }
  return 0;
}